

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.cpp
# Opt level: O3

void Diligent::ValidateFramebufferDesc(FramebufferDesc *Desc,IRenderDevice *pDevice)

{
  Uint32 *Args_2;
  char **Args_6;
  uint *puVar1;
  char cVar2;
  COMPONENT_TYPE CVar3;
  undefined1 uVar4;
  TEXTURE_FORMAT Format;
  ITextureView **ppIVar5;
  char (*Args) [32];
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TextureFormatAttribs *pTVar10;
  TextureFormatAttribs *Args_8_00;
  undefined4 extraout_var_03;
  char **ppcVar11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  char (*Args_1) [47];
  char (*Args_1_00) [37];
  ulong uVar12;
  ITextureView *pIVar13;
  byte bVar14;
  char (*Args_00) [25];
  char (*pacVar15) [33];
  char (*Args_01) [27];
  AttachmentReference *AttchRef;
  ShadingRateAttachment *AttchRef_1;
  TEXTURE_FORMAT *pTVar16;
  long lVar17;
  char (*in_stack_ffffffffffffff68) [48];
  uint local_8c;
  string msg;
  uint local_40;
  uint local_3c;
  IRenderDevice *local_38;
  char **Args_8;
  
  local_38 = pDevice;
  if (Desc->pRenderPass == (IRenderPass *)0x0) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[30]>
              (false,"ValidateFramebufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
               ,0x28,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [30])"render pass must not be null.");
  }
  uVar6 = Desc->AttachmentCount;
  if ((uVar6 != 0) && (Desc->ppAttachments == (ITextureView **)0x0)) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[57]>
              (false,"ValidateFramebufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
               ,0x30,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",
               (char (*) [57])"attachment count is not zero, but ppAttachments is null.");
    uVar6 = Desc->AttachmentCount;
  }
  local_8c = 0;
  if (uVar6 != 0) {
    do {
      if (Desc->ppAttachments[local_8c] == (ITextureView *)0x0) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[24],unsigned_int,char[10]>
                  (false,"ValidateFramebufferDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                   ,0x3a,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [24])"framebuffer attachment ",
                   &local_8c,(char (*) [10])0x752fee);
        uVar6 = Desc->AttachmentCount;
      }
      local_8c = local_8c + 1;
    } while (local_8c < uVar6);
  }
  Args_2 = &Desc->AttachmentCount;
  iVar7 = (*(Desc->pRenderPass->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  Args_8 = (char **)CONCAT44(extraout_var,iVar7);
  Args_6 = Args_8 + 1;
  if (Desc->AttachmentCount != *(Uint32 *)(Args_8 + 1)) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[40],unsigned_int,char[47],unsigned_int,char[23],char_const*,char[3]>
              (false,"ValidateFramebufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
               ,0x45,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",
               (char (*) [40])"the number of framebuffer attachments (",Args_2,
               (char (*) [47])") must be equal to the number of attachments (",(uint *)Args_6,
               (char (*) [23])") in the render pass \'",Args_8,(char (*) [3])"\'.");
  }
  iVar7 = (*(local_38->super_IObject)._vptr_IObject[0x18])();
  iVar7 = *(int *)CONCAT44(extraout_var_00,iVar7);
  local_8c = 0;
  if (*(uint *)Args_6 != 0) {
    do {
      if (Desc->ppAttachments[local_8c] != (ITextureView *)0x0) {
        pTVar16 = (TEXTURE_FORMAT *)(Args_8[2] + (ulong)local_8c * 0x10);
        iVar8 = (*(Desc->ppAttachments[local_8c]->super_IDeviceObject).super_IObject._vptr_IObject
                  [4])();
        cVar2 = *(char *)(CONCAT44(extraout_var_01,iVar8) + 8);
        Args_1 = (char (*) [47])(ulong)local_8c;
        iVar9 = (*(Desc->ppAttachments[(long)Args_1]->super_IDeviceObject).super_IObject.
                  _vptr_IObject[10])();
        if ((iVar7 == 6) && (cVar2 == '\x06')) {
          if ((long *)CONCAT44(extraout_var_02,iVar9) != (long *)0x0) {
            FormatString<char[26],char[47]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"Desc.ppAttachments[i]->GetTexture() == nullptr",Args_1);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x55);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar9) + 0x20))();
          Format = *(TEXTURE_FORMAT *)(CONCAT44(extraout_var_01,iVar8) + 10);
          if (Format != *pTVar16) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            pTVar10 = GetTextureFormatAttribs(Format);
            Args_8_00 = GetTextureFormatAttribs(*pTVar16);
            LogError<true,char[29],char_const*,char[15],char[13],char_const*,char[17],unsigned_int,char[29],char_const*,char[54]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,99,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [13])0x756449,&pTVar10->Name,
                       (char (*) [17])") of attachment ",&local_8c,
                       (char (*) [29])" does not match the format (",&Args_8_00->Name,
                       (char (*) [54])") defined by the render pass for the same attachment.");
          }
          if (*(uint *)(lVar17 + 0x20) != (uint)(byte)(char)pTVar16[1]) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            local_40 = (uint)(byte)(char)pTVar16[1];
            local_3c = *(uint *)(lVar17 + 0x20);
            LogError<true,char[29],char_const*,char[15],char[19],unsigned_int,char[17],unsigned_int,char[35],unsigned_int,char[54]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x6e,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [19])0x75649c,&local_3c,
                       (char (*) [17])") of attachment ",&local_8c,
                       (char (*) [35])" does not match the sample count (",&local_40,
                       (char (*) [54])") defined by the render pass for the same attachment.");
          }
          if ((*(byte *)(lVar17 + 0x2a) & 2) != 0) {
            pTVar10 = GetTextureFormatAttribs(*pTVar16);
            CVar3 = pTVar10->ComponentType;
            if (*(byte *)((long)pTVar16 + 3) == 0) {
LAB_0049844d:
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[48]>
                        (false,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0x78,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"memoryless attachment ",
                         &local_8c,(char (*) [48])" is not compatible with ATTACHMENT_LOAD_OP_LOAD")
              ;
              if ((char)pTVar16[2] != TEX_FORMAT_UNKNOWN) {
                if (CVar3 == COMPONENT_TYPE_DEPTH_STENCIL) {
LAB_004984b3:
                  uVar4 = (undefined1)pTVar16[3];
                  goto joined_r0x004984c1;
                }
                goto LAB_0049851d;
              }
            }
            else if (CVar3 == COMPONENT_TYPE_DEPTH_STENCIL) {
              if (*(byte *)((long)pTVar16 + 5) == 0) goto LAB_0049844d;
              if ((char)pTVar16[2] != TEX_FORMAT_UNKNOWN) goto LAB_004984b3;
            }
            else {
              uVar4 = (undefined1)pTVar16[2];
joined_r0x004984c1:
              if (uVar4 != TEX_FORMAT_UNKNOWN) goto LAB_0049851d;
            }
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[50]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x7d,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"memoryless attachment ",
                       &local_8c,(char (*) [50])" is not compatible with ATTACHMENT_STORE_OP_STORE")
            ;
          }
        }
      }
LAB_0049851d:
      local_8c = local_8c + 1;
    } while (local_8c < *(uint *)Args_6);
  }
  local_8c = 0;
  if (*(int *)(Args_8 + 3) != 0) {
    do {
      puVar1 = (uint *)(Args_8[4] + (ulong)local_8c * 0x48);
      if (*puVar1 != 0) {
        lVar17 = 0;
        uVar12 = 0;
        do {
          uVar6 = *(uint *)(*(long *)(puVar1 + 2) + lVar17);
          if (uVar6 != 0xffffffff) {
            Args_00 = (char (*) [25])(*(long *)(puVar1 + 2) + lVar17);
            if (*Args_2 <= uVar6) {
              FormatString<char[25],unsigned_int,char[43],unsigned_int,char[48]>
                        (&msg,(Diligent *)"Input attachment index (",Args_00,
                         (uint *)") must be less than the attachment count (",(char (*) [43])Args_2,
                         (uint *)") as this is ensured by ValidateRenderPassDesc.",
                         in_stack_ffffffffffffff68);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0xb1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
              uVar6 = *(uint *)*Args_00;
            }
            pIVar13 = Desc->ppAttachments[uVar6];
            if (pIVar13 == (ITextureView *)0x0) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[41],unsigned_int,char[18],char_const*,char[25]>
                        (false,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0xb8,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [21])0x75af16,(uint *)Args_00,
                         (char (*) [41])" is used as input attachment by subpass ",&local_8c,
                         (char (*) [18])0x75a7d7,Args_8,(char (*) [25])"\', and must not be null.");
              pIVar13 = Desc->ppAttachments[*(uint *)*Args_00];
            }
            iVar8 = (*(pIVar13->super_IDeviceObject).super_IObject._vptr_IObject[10])();
            ppcVar11 = (char **)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar8) + 0x20))();
            if ((*(byte *)((long)ppcVar11 + 0x25) & 2) == 0) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[41],unsigned_int,char[18],char_const*,char[61]>
                        (false,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0xc6,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [17])"the attachment \'",
                         ppcVar11,(char (*) [12])"\' at index ",(uint *)Args_00,
                         (char (*) [41])" is used as input attachment by subpass ",&local_8c,
                         (char (*) [18])0x75a7d7,Args_8,
                         (char (*) [61])
                         "\', but was not created with BIND_INPUT_ATTACHMENT bind flag.");
            }
          }
          uVar12 = uVar12 + 1;
          lVar17 = lVar17 + 8;
        } while (uVar12 < *puVar1);
      }
      if (puVar1[4] != 0) {
        lVar17 = 0;
        uVar12 = 0;
        do {
          uVar6 = *(uint *)(*(long *)(puVar1 + 6) + lVar17);
          if (uVar6 != 0xffffffff) {
            pacVar15 = (char (*) [33])(*(long *)(puVar1 + 6) + lVar17);
            if (*Args_2 <= uVar6) {
              FormatString<char[33],unsigned_int,char[43],unsigned_int,char[48]>
                        (&msg,(Diligent *)"Render target attachment index (",pacVar15,
                         (uint *)") must be less than the attachment count (",(char (*) [43])Args_2,
                         (uint *)") as this is ensured by ValidateRenderPassDesc.",
                         in_stack_ffffffffffffff68);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0xd2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
              uVar6 = *(uint *)*pacVar15;
            }
            ppIVar5 = Desc->ppAttachments;
            pIVar13 = ppIVar5[uVar6];
            if (pIVar13 == (ITextureView *)0x0) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[25]>
                        (false,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0xda,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [21])0x75af16,(uint *)pacVar15,
                         (char (*) [49])" is used as render target attachment by subpass ",&local_8c
                         ,(char (*) [18])0x75a7d7,Args_8,(char (*) [25])"\', and must not be null.")
              ;
              pIVar13 = ppIVar5[uVar6];
            }
            iVar8 = (*(pIVar13->super_IDeviceObject).super_IObject._vptr_IObject[4])();
            if (*(char *)(CONCAT44(extraout_var_04,iVar8) + 8) != '\x02') {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[44]>
                        (false,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0xe3,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [21])0x75af16,(uint *)pacVar15,
                         (char (*) [49])" is used as render target attachment by subpass ",&local_8c
                         ,(char (*) [18])0x75a7d7,Args_8,
                         (char (*) [44])"\', but is not a TEXTURE_VIEW_RENDER_TARGET.");
            }
            iVar8 = (*(ppIVar5[uVar6]->super_IDeviceObject).super_IObject._vptr_IObject[10])();
            ppcVar11 = (char **)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar8) + 0x20))();
            if ((*(byte *)((long)ppcVar11 + 0x24) & 0x20) == 0) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[58]>
                        (false,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0xf1,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [17])"the attachment \'",
                         ppcVar11,(char (*) [12])"\' at index ",(uint *)pacVar15,
                         (char (*) [49])" is used as render target attachment by subpass ",&local_8c
                         ,(char (*) [18])0x75a7d7,Args_8,
                         (char (*) [58])"\', but was not created with BIND_RENDER_TARGET bind flag."
                        );
            }
          }
          uVar12 = uVar12 + 1;
          lVar17 = lVar17 + 8;
        } while (uVar12 < puVar1[4]);
        if (*(long *)(puVar1 + 8) != 0 && puVar1[4] != 0) {
          lVar17 = 0;
          uVar12 = 0;
          do {
            uVar6 = *(uint *)(*(long *)(puVar1 + 8) + lVar17);
            if (uVar6 != 0xffffffff) {
              Args_01 = (char (*) [27])(*(long *)(puVar1 + 8) + lVar17);
              if (*Args_2 <= uVar6) {
                FormatString<char[27],unsigned_int,char[43],unsigned_int,char[48]>
                          (&msg,(Diligent *)"Resolve attachment index (",Args_01,
                           (uint *)") must be less than the attachment count (",
                           (char (*) [43])Args_2,
                           (uint *)") as this is ensured by ValidateRenderPassDesc.",
                           in_stack_ffffffffffffff68);
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"ValidateFramebufferDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                           ,0xff);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
                uVar6 = *(uint *)*Args_01;
              }
              ppIVar5 = Desc->ppAttachments;
              pIVar13 = ppIVar5[uVar6];
              if (pIVar13 == (ITextureView *)0x0) {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[25]>
                          (false,"ValidateFramebufferDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                           ,0x107,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",(char (*) [21])0x75af16,(uint *)Args_01,
                           (char (*) [43])" is used as resolve attachment by subpass ",&local_8c,
                           (char (*) [18])0x75a7d7,Args_8,(char (*) [25])"\', and must not be null."
                          );
                pIVar13 = ppIVar5[uVar6];
              }
              iVar8 = (*(pIVar13->super_IDeviceObject).super_IObject._vptr_IObject[4])();
              if (*(char *)(CONCAT44(extraout_var_06,iVar8) + 8) != '\x02') {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[44]>
                          (false,"ValidateFramebufferDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                           ,0x110,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",(char (*) [21])0x75af16,(uint *)Args_01,
                           (char (*) [43])" is used as resolve attachment by subpass ",&local_8c,
                           (char (*) [18])0x75a7d7,Args_8,
                           (char (*) [44])"\', but is not a TEXTURE_VIEW_RENDER_TARGET.");
              }
              iVar8 = (*(ppIVar5[uVar6]->super_IDeviceObject).super_IObject._vptr_IObject[10])();
              ppcVar11 = (char **)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar8) + 0x20))();
              if ((*(byte *)((long)ppcVar11 + 0x24) & 0x20) == 0) {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[58]>
                          (false,"ValidateFramebufferDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                           ,0x11e,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",(char (*) [17])"the attachment \'",
                           ppcVar11,(char (*) [12])"\' at index ",(uint *)Args_01,
                           (char (*) [43])" is used as resolve attachment by subpass ",&local_8c,
                           (char (*) [18])0x75a7d7,Args_8,
                           (char (*) [58])
                           "\', but was not created with BIND_RENDER_TARGET bind flag.");
              }
            }
            uVar12 = uVar12 + 1;
            lVar17 = lVar17 + 8;
          } while (uVar12 < puVar1[4]);
        }
      }
      pacVar15 = *(char (**) [33])(puVar1 + 10);
      if ((pacVar15 != (char (*) [33])0x0) && (uVar6 = *(uint *)*pacVar15, uVar6 != 0xffffffff)) {
        if (*Args_2 <= uVar6) {
          FormatString<char[33],unsigned_int,char[43],unsigned_int,char[48]>
                    (&msg,(Diligent *)"Depth-stencil attachment index (",pacVar15,
                     (uint *)") must be less than the attachment count (",(char (*) [43])Args_2,
                     (uint *)") as this is ensured by ValidateRenderPassDesc.",
                     in_stack_ffffffffffffff68);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0x12a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
          uVar6 = *(uint *)*pacVar15;
        }
        ppIVar5 = Desc->ppAttachments;
        pIVar13 = ppIVar5[uVar6];
        if (pIVar13 == (ITextureView *)0x0) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[25]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0x132,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",(char (*) [21])0x75af16,(uint *)pacVar15,
                     (char (*) [49])" is used as depth-stencil attachment by subpass ",&local_8c,
                     (char (*) [18])0x75a7d7,Args_8,(char (*) [25])"\', and must not be null.");
          pIVar13 = ppIVar5[uVar6];
        }
        iVar8 = (*(pIVar13->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (1 < (byte)(*(char *)(CONCAT44(extraout_var_08,iVar8) + 8) - 3U)) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[84]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0x13b,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",(char (*) [21])0x75af16,(uint *)pacVar15,
                     (char (*) [49])" is used as depth-stencil attachment by subpass ",&local_8c,
                     (char (*) [18])0x75a7d7,Args_8,
                     (char (*) [84])
                     "\', but is not a TEXTURE_VIEW_DEPTH_STENCIL or TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL."
                    );
        }
        iVar8 = (*(ppIVar5[uVar6]->super_IDeviceObject).super_IObject._vptr_IObject[10])();
        ppcVar11 = (char **)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar8) + 0x20))();
        if ((*(byte *)((long)ppcVar11 + 0x24) & 0x40) == 0) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[58]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0x149,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",(char (*) [17])"the attachment \'",ppcVar11,
                     (char (*) [12])"\' at index ",(uint *)pacVar15,
                     (char (*) [49])" is used as depth-stencil attachment by subpass ",&local_8c,
                     (char (*) [18])0x75a7d7,Args_8,
                     (char (*) [58])"\', but was not created with BIND_DEPTH_STENCIL bind flag.");
        }
      }
      local_8c = local_8c + 1;
    } while (local_8c < *(uint *)(Args_8 + 3));
    local_8c = 0;
    if (*(uint *)(Args_8 + 3) != 0) {
      bVar14 = 0;
      do {
        Args_1_00 = (char (*) [37])Args_8[4];
        Args = *(char (**) [32])((long)Args_1_00 + (ulong)local_8c * 0x48 + 0x40);
        if ((Args != (char (*) [32])0x0) && (uVar6 = *(uint *)*Args, uVar6 != 0xffffffff)) {
          if (*Args_2 <= uVar6) {
            FormatString<char[32],unsigned_int,char[43],unsigned_int,char[48]>
                      (&msg,(Diligent *)"Shading rate attachment index (",Args,
                       (uint *)") must be less than the attachment count (",(char (*) [43])Args_2,
                       (uint *)") as this is ensured by ValidateRenderPassDesc.",
                       in_stack_ffffffffffffff68);
            Args_1_00 = (char (*) [37])0x15a;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x15a);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            uVar6 = *(uint *)*Args;
          }
          ppIVar5 = Desc->ppAttachments;
          pIVar13 = ppIVar5[uVar6];
          if (pIVar13 == (ITextureView *)0x0) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            Args_1_00 = (char (*) [37])0x162;
            LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[48],unsigned_int,char[18],char_const*,char[25]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x162,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [21])0x75af16,(uint *)Args,
                       (char (*) [48])" is used as shading rate attachment by subpass ",&local_8c,
                       (char (*) [18])0x75a7d7,Args_8,(char (*) [25])"\', and must not be null.");
            pIVar13 = ppIVar5[uVar6];
          }
          iVar8 = (*(pIVar13->super_IDeviceObject).super_IObject._vptr_IObject[4])();
          if (*(char *)(CONCAT44(extraout_var_10,iVar8) + 8) != '\x06') {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            Args_1_00 = (char (*) [37])0x16b;
            LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[48],unsigned_int,char[18],char_const*,char[43]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x16b,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [21])0x75af16,(uint *)Args,
                       (char (*) [48])" is used as shading rate attachment by subpass ",&local_8c,
                       (char (*) [18])0x75a7d7,Args_8,
                       (char (*) [43])"\', but is not a TEXTURE_VIEW_SHADING_RATE.");
          }
          iVar8 = (*(ppIVar5[uVar6]->super_IDeviceObject).super_IObject._vptr_IObject[10])();
          if (iVar7 == 6) {
            bVar14 = 1;
            if ((long *)CONCAT44(extraout_var_11,iVar8) != (long *)0x0) {
              FormatString<char[26],char[37]>
                        (&msg,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"pAttachment->GetTexture() == nullptr",Args_1_00);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0x170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
          }
          else {
            ppcVar11 = (char **)(**(code **)(*(long *)CONCAT44(extraout_var_11,iVar8) + 0x20))();
            bVar14 = 1;
            if ((*(byte *)((long)ppcVar11 + 0x25) & 8) == 0) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[48],unsigned_int,char[18],char_const*,char[57]>
                        (false,"ValidateFramebufferDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                         ,0x17a,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [17])"the attachment \'",
                         ppcVar11,(char (*) [12])"\' at index ",(uint *)Args,
                         (char (*) [48])" is used as shading rate attachment by subpass ",&local_8c,
                         (char (*) [18])0x75a7d7,Args_8,
                         (char (*) [57])"\', but was not created with BIND_SHADING_RATE bind flag.")
              ;
            }
          }
        }
        local_8c = local_8c + 1;
      } while (local_8c < *(uint *)(Args_8 + 3));
      bVar14 = bVar14 ^ 1;
      goto LAB_004990f5;
    }
  }
  local_8c = 0;
  bVar14 = 1;
LAB_004990f5:
  iVar8 = (*(local_38->super_IObject)._vptr_IObject[0x19])();
  if ((!(bool)(iVar7 == 6 | bVar14)) &&
     (uVar6 = *(uint *)(CONCAT44(extraout_var_12,iVar8) + 0x154), (uVar6 >> 0xb & 1) == 0)) {
    if ((uVar6 >> 0xc & 1) == 0) {
      FormatString<char[121]>
                (&msg,(char (*) [121])
                      "One of NON_SUBSAMPLED_RENDER_TARGET or SUBSAMPLED_RENDER_TARGET caps must be presented if texture-based VRS is supported"
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidateFramebufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                 ,0x187);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    local_8c = 0;
    if (*(uint *)Args_6 != 0) {
      do {
        if ((Desc->ppAttachments[local_8c] != (ITextureView *)0x0) &&
           (iVar7 = (*(Desc->ppAttachments[local_8c]->super_IDeviceObject).super_IObject.
                      _vptr_IObject[4])(), *(char *)(CONCAT44(extraout_var_13,iVar7) + 8) != '\x06')
           ) {
          iVar7 = (*(Desc->ppAttachments[local_8c]->super_IDeviceObject).super_IObject._vptr_IObject
                    [10])();
          lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar7) + 0x20))();
          if ((*(byte *)(lVar17 + 0x2a) & 8) == 0) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[12],unsigned_int,char[58],char[88],char[105]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x196,(char (*) [29])"Description of framebuffer \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [12])0x75642d,&local_8c,
                       (char (*) [58])" must be created with MISC_TEXTURE_FLAG_SUBSAMPLED flag. ",
                       (char (*) [88])
                       "If capability SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET is not supported, all "
                       ,(char (*) [105])
                        "attachments except shading rate texture must have been created with a MISC_TEXTURE_FLAG_SUBSAMPLED flag."
                      );
          }
        }
        local_8c = local_8c + 1;
      } while (local_8c < *(uint *)Args_6);
    }
  }
  return;
}

Assistant:

void ValidateFramebufferDesc(const FramebufferDesc& Desc, IRenderDevice* pDevice) noexcept(false)
{
#define LOG_FRAMEBUFFER_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of framebuffer '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    if (Desc.pRenderPass == nullptr)
    {
        LOG_FRAMEBUFFER_ERROR_AND_THROW("render pass must not be null.");
    }

    if (Desc.AttachmentCount != 0 && Desc.ppAttachments == nullptr)
    {
        // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, and attachmentCount is not 0,
        // pAttachments must be a valid pointer to an array of attachmentCount valid VkImageView handles.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-flags-02778
        LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment count is not zero, but ppAttachments is null.");
    }

    for (Uint32 i = 0; i < Desc.AttachmentCount; ++i)
    {
        if (Desc.ppAttachments[i] == nullptr)
        {
            // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, and attachmentCount is not 0,
            // pAttachments must be a valid pointer to an array of attachmentCount valid VkImageView handles.
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-flags-02778
            LOG_FRAMEBUFFER_ERROR_AND_THROW("framebuffer attachment ", i, " is null.");
        }
    }

    const auto& RPDesc = Desc.pRenderPass->GetDesc();
    if (Desc.AttachmentCount != RPDesc.AttachmentCount)
    {
        // AttachmentCount must be equal to the attachment count specified in renderPass.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-attachmentCount-00876
        LOG_FRAMEBUFFER_ERROR_AND_THROW("the number of framebuffer attachments (", Desc.AttachmentCount,
                                        ") must be equal to the number of attachments (", RPDesc.AttachmentCount,
                                        ") in the render pass '", RPDesc.Name, "'.");
    }

    const bool IsMetal = pDevice->GetDeviceInfo().IsMetalDevice();

    for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
    {
        if (Desc.ppAttachments[i] == nullptr)
            continue;

        const auto& AttDesc  = RPDesc.pAttachments[i];
        const auto& ViewDesc = Desc.ppAttachments[i]->GetDesc();

        // Metal backend has different implementation for ITextureView with shading rate view.
        if (IsMetal && ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE)
        {
            VERIFY_EXPR(Desc.ppAttachments[i]->GetTexture() == nullptr);
            continue;
        }

        const auto& TexDesc = Desc.ppAttachments[i]->GetTexture()->GetDesc();

        // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments
        // must have been created with a VkFormat value that matches the VkFormat specified by the corresponding
        // VkAttachmentDescription in renderPass
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00880
        if (ViewDesc.Format != AttDesc.Format)
        {
            LOG_FRAMEBUFFER_ERROR_AND_THROW("the format (", GetTextureFormatAttribs(ViewDesc.Format).Name, ") of attachment ", i,
                                            " does not match the format (", GetTextureFormatAttribs(AttDesc.Format).Name,
                                            ") defined by the render pass for the same attachment.");
        }

        // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments must have
        // been created with a samples value that matches the samples value specified by the corresponding
        // VkAttachmentDescription in renderPass
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00881
        if (TexDesc.SampleCount != AttDesc.SampleCount)
        {
            LOG_FRAMEBUFFER_ERROR_AND_THROW("the sample count (", Uint32{TexDesc.SampleCount}, ") of attachment ", i,
                                            " does not match the sample count (", Uint32{AttDesc.SampleCount},
                                            ") defined by the render pass for the same attachment.");
        }

        if ((TexDesc.MiscFlags & MISC_TEXTURE_FLAG_MEMORYLESS) != 0)
        {
            const bool HasStencilComponent = GetTextureFormatAttribs(AttDesc.Format).ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;

            if (AttDesc.LoadOp == ATTACHMENT_LOAD_OP_LOAD ||
                (HasStencilComponent && AttDesc.StencilLoadOp == ATTACHMENT_LOAD_OP_LOAD))
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("memoryless attachment ", i, " is not compatible with ATTACHMENT_LOAD_OP_LOAD");
            }
            if (AttDesc.StoreOp == ATTACHMENT_STORE_OP_STORE ||
                (HasStencilComponent && AttDesc.StencilStoreOp == ATTACHMENT_STORE_OP_STORE))
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("memoryless attachment ", i, " is not compatible with ATTACHMENT_STORE_OP_STORE");
            }

#if PLATFORM_MACOS || PLATFORM_IOS || PLATFORM_TVOS
            {
                Uint32 NumSubpasses = 0;
                for (Uint32 s = 0; s < RPDesc.SubpassCount; ++s)
                {
                    const auto& Subpass = RPDesc.pSubpasses[s];

                    bool UsedInSubpass = false;
                    for (Uint32 rt_attachment = 0; rt_attachment < Subpass.RenderTargetAttachmentCount; ++rt_attachment)
                    {
                        const auto& AttchRef = Subpass.pRenderTargetAttachments[rt_attachment];
                        if (AttchRef.AttachmentIndex == i)
                            UsedInSubpass = true;
                    }
                    for (Uint32 input_attachment = 0; input_attachment < Subpass.InputAttachmentCount; ++input_attachment)
                    {
                        const auto& AttchRef = Subpass.pInputAttachments[input_attachment];
                        if (AttchRef.AttachmentIndex == i)
                            UsedInSubpass = true;
                    }
                    if (Subpass.pDepthStencilAttachment != nullptr && Subpass.pDepthStencilAttachment->AttachmentIndex == i)
                        UsedInSubpass = true;

                    if (UsedInSubpass)
                        ++NumSubpasses;
                }
                if (NumSubpasses > 1)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("memoryless attachment ", i,
                                                    " is used in more than one subpass, which is not supported on MacOS/iOS "
                                                    "as the contents of the attachment can't be preserved between subpasses without "
                                                    "storing it in global memory.");
                }
            }
#endif
        }
    }

    for (Uint32 i = 0; i < RPDesc.SubpassCount; ++i)
    {
        const auto& Subpass = RPDesc.pSubpasses[i];
        for (Uint32 input_attachment = 0; input_attachment < Subpass.InputAttachmentCount; ++input_attachment)
        {
            const auto& AttchRef = Subpass.pInputAttachments[input_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            VERIFY(AttchRef.AttachmentIndex < Desc.AttachmentCount,
                   "Input attachment index (", AttchRef.AttachmentIndex, ") must be less than the attachment count (",
                   Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

            if (Desc.ppAttachments[AttchRef.AttachmentIndex] == nullptr)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                " is used as input attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', and must not be null.");
            }

            const auto& TexDesc = Desc.ppAttachments[AttchRef.AttachmentIndex]->GetTexture()->GetDesc();

            // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments that
            // is used as an input attachment by renderPass must have been created with a usage value including
            // VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00879
            if ((TexDesc.BindFlags & BIND_INPUT_ATTACHMENT) == 0)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.AttachmentIndex,
                                                " is used as input attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', but was not created with BIND_INPUT_ATTACHMENT bind flag.");
            }
        }

        for (Uint32 rt_attachment = 0; rt_attachment < Subpass.RenderTargetAttachmentCount; ++rt_attachment)
        {
            const auto& AttchRef = Subpass.pRenderTargetAttachments[rt_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            VERIFY(AttchRef.AttachmentIndex < Desc.AttachmentCount,
                   "Render target attachment index (", AttchRef.AttachmentIndex, ") must be less than the attachment count (",
                   Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

            const auto& pAttachment = Desc.ppAttachments[AttchRef.AttachmentIndex];
            if (pAttachment == nullptr)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                " is used as render target attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', and must not be null.");
            }

            const auto& ViewDesc = pAttachment->GetDesc();
            if (ViewDesc.ViewType != TEXTURE_VIEW_RENDER_TARGET)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                " is used as render target attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', but is not a TEXTURE_VIEW_RENDER_TARGET.");
            }

            const auto& TexDesc = pAttachment->GetTexture()->GetDesc();

            // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments that is used
            // as a color attachment or resolve attachment by renderPass must have been created with a usage value including
            // VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00877
            if ((TexDesc.BindFlags & BIND_RENDER_TARGET) == 0)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.AttachmentIndex,
                                                " is used as render target attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', but was not created with BIND_RENDER_TARGET bind flag.");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 rslv_attachment = 0; rslv_attachment < Subpass.RenderTargetAttachmentCount; ++rslv_attachment)
            {
                const auto& AttchRef = Subpass.pResolveAttachments[rslv_attachment];
                if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                    continue;

                VERIFY(AttchRef.AttachmentIndex < Desc.AttachmentCount,
                       "Resolve attachment index (", AttchRef.AttachmentIndex, ") must be less than the attachment count (",
                       Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

                const auto& pAttachment = Desc.ppAttachments[AttchRef.AttachmentIndex];
                if (pAttachment == nullptr)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                    " is used as resolve attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', and must not be null.");
                }

                const auto& ViewDesc = pAttachment->GetDesc();
                if (ViewDesc.ViewType != TEXTURE_VIEW_RENDER_TARGET)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                    " is used as resolve attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but is not a TEXTURE_VIEW_RENDER_TARGET.");
                }

                const auto& TexDesc = pAttachment->GetTexture()->GetDesc();

                // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments that is used
                // as a color attachment or resolve attachment by renderPass must have been created with a usage value including
                // VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00877
                if ((TexDesc.BindFlags & BIND_RENDER_TARGET) == 0)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.AttachmentIndex,
                                                    " is used as resolve attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but was not created with BIND_RENDER_TARGET bind flag.");
                }
            }
        }

        if (Subpass.pDepthStencilAttachment != nullptr)
        {
            const auto& AttchRef = *Subpass.pDepthStencilAttachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                VERIFY(AttchRef.AttachmentIndex < Desc.AttachmentCount,
                       "Depth-stencil attachment index (", AttchRef.AttachmentIndex, ") must be less than the attachment count (",
                       Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

                const auto& pAttachment = Desc.ppAttachments[AttchRef.AttachmentIndex];
                if (pAttachment == nullptr)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                    " is used as depth-stencil attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', and must not be null.");
                }

                const auto& ViewDesc = pAttachment->GetDesc();
                if (ViewDesc.ViewType != TEXTURE_VIEW_DEPTH_STENCIL && ViewDesc.ViewType != TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                    " is used as depth-stencil attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but is not a TEXTURE_VIEW_DEPTH_STENCIL or TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL.");
                }

                const auto& TexDesc = pAttachment->GetTexture()->GetDesc();

                // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments that is
                // used as a depth/stencil attachment by renderPass must have been created with a usage value including
                // VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-02633
                if ((TexDesc.BindFlags & BIND_DEPTH_STENCIL) == 0)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.AttachmentIndex,
                                                    " is used as depth-stencil attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but was not created with BIND_DEPTH_STENCIL bind flag.");
                }
            }
        }
    }

    bool IsVRSEnabled = false;
    for (Uint32 i = 0; i < RPDesc.SubpassCount; ++i)
    {
        const auto& Subpass = RPDesc.pSubpasses[i];
        if (Subpass.pShadingRateAttachment != nullptr)
        {
            const auto& AttchRef = *Subpass.pShadingRateAttachment;
            if (AttchRef.Attachment.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                VERIFY(AttchRef.Attachment.AttachmentIndex < Desc.AttachmentCount,
                       "Shading rate attachment index (", AttchRef.Attachment.AttachmentIndex, ") must be less than the attachment count (",
                       Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

                const auto& pAttachment = Desc.ppAttachments[AttchRef.Attachment.AttachmentIndex];
                if (pAttachment == nullptr)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.Attachment.AttachmentIndex,
                                                    " is used as shading rate attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', and must not be null.");
                }

                const auto& ViewDesc = pAttachment->GetDesc();
                if (ViewDesc.ViewType != TEXTURE_VIEW_SHADING_RATE)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.Attachment.AttachmentIndex,
                                                    " is used as shading rate attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but is not a TEXTURE_VIEW_SHADING_RATE.");
                }

                if (IsMetal)
                {
                    VERIFY_EXPR(pAttachment->GetTexture() == nullptr);
                }
                else
                {
                    const auto& TexDesc = pAttachment->GetTexture()->GetDesc();
                    if ((TexDesc.BindFlags & BIND_SHADING_RATE) == 0)
                    {
                        LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.Attachment.AttachmentIndex,
                                                        " is used as shading rate attachment by subpass ",
                                                        i, " of render pass '", RPDesc.Name,
                                                        "', but was not created with BIND_SHADING_RATE bind flag.");
                    }
                }

                IsVRSEnabled = true;
            }
        }
    }

    const auto& SRProps = pDevice->GetAdapterInfo().ShadingRate;
    if (!IsMetal && IsVRSEnabled && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET) == 0)
    {
        VERIFY((SRProps.CapFlags & SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET) != 0,
               "One of NON_SUBSAMPLED_RENDER_TARGET or SUBSAMPLED_RENDER_TARGET caps must be presented if texture-based VRS is supported");

        for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
        {
            if (Desc.ppAttachments[i] == nullptr)
                continue;

            if (Desc.ppAttachments[i]->GetDesc().ViewType == TEXTURE_VIEW_SHADING_RATE)
                continue;

            const auto& TexDesc = Desc.ppAttachments[i]->GetTexture()->GetDesc();
            if ((TexDesc.MiscFlags & MISC_TEXTURE_FLAG_SUBSAMPLED) == 0)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment ", i, " must be created with MISC_TEXTURE_FLAG_SUBSAMPLED flag. ",
                                                "If capability SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET is not supported, all ",
                                                "attachments except shading rate texture must have been created with a MISC_TEXTURE_FLAG_SUBSAMPLED flag.");
            }
        }
    }
}